

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

SortOrder __thiscall QSortedModelEngine::sortOrder(QSortedModelEngine *this,QModelIndex *parent)

{
  int iVar1;
  long *plVar2;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int rowCount;
  QAbstractItemModel *model;
  QString last;
  QString first;
  QString *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  SortOrder local_ac;
  undefined1 local_a8 [24];
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 local_78 [24];
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = (long *)QAbstractProxyModel::sourceModel();
  iVar1 = (**(code **)(*plVar2 + 0x78))(plVar2,in_RSI);
  if (iVar1 < 2) {
    local_ac = AscendingOrder;
  }
  else {
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*plVar2 + 0x60))
              (local_78,plVar2,0,*(undefined4 *)(*(long *)(in_RDI + 0x68) + 0xc0),in_RSI);
    (**(code **)(*plVar2 + 0x90))
              (&local_28,plVar2,local_78,*(undefined4 *)(*(long *)(in_RDI + 0x68) + 0xbc));
    ::QVariant::toString();
    ::QVariant::~QVariant(&local_28);
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*plVar2 + 0x60))
              (local_a8,plVar2,iVar1 + -1,*(undefined4 *)(*(long *)(in_RDI + 0x68) + 0xc0),in_RSI);
    (**(code **)(*plVar2 + 0x90))(&local_48,plVar2,local_a8);
    ::QVariant::toString();
    ::QVariant::~QVariant(&local_48);
    iVar1 = QString::compare((QString *)
                             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff08,CaseInsensitive);
    local_ac = (SortOrder)(0 < iVar1);
    QString::~QString((QString *)0xa6b49c);
    QString::~QString((QString *)0xa6b4a9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_ac;
  }
  __stack_chk_fail();
}

Assistant:

Qt::SortOrder QSortedModelEngine::sortOrder(const QModelIndex &parent) const
{
    const QAbstractItemModel *model = c->proxy->sourceModel();

    int rowCount = model->rowCount(parent);
    if (rowCount < 2)
        return Qt::AscendingOrder;
    QString first = model->data(model->index(0, c->column, parent), c->role).toString();
    QString last = model->data(model->index(rowCount - 1, c->column, parent), c->role).toString();
    return QString::compare(first, last, c->cs) <= 0 ? Qt::AscendingOrder : Qt::DescendingOrder;
}